

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O2

D_Pass * find_pass(Grammar *g,char *start,char *end)

{
  byte bVar1;
  uint uVar2;
  D_Pass *pDVar3;
  int iVar4;
  ushort **ppuVar5;
  ulong uVar6;
  char *pcVar7;
  
  pcVar7 = start;
  while ((bVar1 = *start, (ulong)bVar1 != 0 &&
         (ppuVar5 = __ctype_b_loc(), (*(byte *)((long)*ppuVar5 + (ulong)bVar1 * 2 + 1) & 0x20) != 0)
         )) {
    start = (char *)((byte *)start + 1);
    pcVar7 = pcVar7 + 1;
  }
  uVar2 = (g->passes).n;
  uVar6 = 0;
  while( true ) {
    if (uVar2 == uVar6) {
      return (D_Pass *)0x0;
    }
    pDVar3 = (g->passes).v[uVar6];
    if (((int)end - pDVar3->name_len == (int)pcVar7) &&
       (iVar4 = strncmp(pDVar3->name,start,(ulong)(uint)((int)end - (int)pcVar7)), iVar4 == 0))
    break;
    uVar6 = uVar6 + 1;
  }
  return pDVar3;
}

Assistant:

D_Pass *find_pass(Grammar *g, char *start, char *end) {
  uint i, l;
  while (*start && isspace_(*start)) start++;
  l = end - start;
  for (i = 0; i < g->passes.n; i++)
    if (l == g->passes.v[i]->name_len && !strncmp(g->passes.v[i]->name, start, l)) return g->passes.v[i];
  return NULL;
}